

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::ToNumber(Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  double value;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  
  bVar1 = TaggedInt::Is(aRight);
  aRight_local = aRight;
  if ((!bVar1) && (bVar1 = JavascriptNumber::Is_NoTaggedIntCheck(aRight), !bVar1)) {
    value = JavascriptConversion::ToNumber_Full(aRight,scriptContext);
    aRight_local = JavascriptNumber::ToVarIntCheck(value,scriptContext);
  }
  return aRight_local;
}

Assistant:

Var JavascriptOperators::ToNumber(Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_ConvNumber_Full);
        if (TaggedInt::Is(aRight) || (JavascriptNumber::Is_NoTaggedIntCheck(aRight)))
        {
            return aRight;
        }

        return JavascriptNumber::ToVarIntCheck(JavascriptConversion::ToNumber_Full(aRight, scriptContext), scriptContext);
        JIT_HELPER_END(Op_ConvNumber_Full);
    }